

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

void __thiscall wallet::CWallet::blockDisconnected(CWallet *this,BlockInfo *block)

{
  uint256 *puVar1;
  pointer psVar2;
  element_type *peVar3;
  pointer __k;
  pointer pCVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  uint256 **ppuVar9;
  CBlock **ppCVar10;
  size_type sVar11;
  _Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false> _Var12;
  iterator iVar13;
  pointer ptx;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
  pVar14;
  int disconnect_height;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock29;
  int local_7c;
  unique_lock<std::recursive_mutex> local_78;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  undefined1 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (block->data == (CBlock *)0x0) {
    __assert_fail("block.data",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                  ,0x5fa,
                  "virtual void wallet::CWallet::blockDisconnected(const interfaces::BlockInfo &)");
  }
  local_78._M_device = &(this->cs_wallet).super_recursive_mutex;
  local_78._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_78);
  this->m_last_block_processed_height = block->height + -1;
  ppuVar9 = inline_assertion_check<true,uint256_const*const&>
                      (&block->prev_hash,
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                       ,0x602,"blockDisconnected","block.prev_hash");
  puVar1 = *ppuVar9;
  uVar5 = *(undefined8 *)(puVar1->super_base_blob<256U>).m_data._M_elems;
  uVar6 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
  uVar7 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
  *(undefined8 *)((this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
  *(undefined8 *)((this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x18) =
       uVar7;
  *(undefined8 *)(this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems = uVar5;
  *(undefined8 *)((this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 8) = uVar6;
  local_7c = block->height;
  ppCVar10 = inline_assertion_check<true,CBlock_const*const&>
                       (&block->data,
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                        ,0x606,"blockDisconnected","block.data");
  ptx = ((*ppCVar10)->vtx).
        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = ((*ppCVar10)->vtx).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ptx != psVar2) {
    do {
      local_68._M_unused._M_member_pointer =
           local_68._M_unused._M_member_pointer & 0xffffffffffffff00;
      local_40 = 2;
      bVar8 = AddToWalletIfInvolvingMe(this,ptx,(SyncTxState *)&local_68,true,false);
      if (bVar8) {
        MarkInputsDirty(this,ptx);
      }
      peVar3 = (ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      pCVar4 = (peVar3->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (__k = (peVar3->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start; __k != pCVar4; __k = __k + 1) {
        sVar11 = std::
                 _Hashtable<COutPoint,_std::pair<const_COutPoint,_uint256>,_std::allocator<std::pair<const_COutPoint,_uint256>_>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                 ::count(&(this->mapTxSpends)._M_h,&__k->prevout);
        if (sVar11 != 0) {
          pVar14 = std::
                   _Hashtable<COutPoint,_std::pair<const_COutPoint,_uint256>,_std::allocator<std::pair<const_COutPoint,_uint256>_>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                   ::equal_range(&(this->mapTxSpends)._M_h,&__k->prevout);
          for (_Var12._M_cur =
                    (__node_type *)
                    pVar14.first.
                    super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>._M_cur;
              (_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>)_Var12._M_cur !=
              pVar14.second.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>.
              _M_cur.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>;
              _Var12._M_cur = (__node_type *)((_Var12._M_cur)->super__Hash_node_base)._M_nxt) {
            iVar13 = _GLOBAL__N_1::std::
                     _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)&this->mapWallet,
                            (key_type *)
                            ((long)&((_Var12._M_cur)->
                                    super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>
                                    ._M_storage._M_storage + 0x24));
            if (*(char *)((long)iVar13.
                                super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                ._M_cur + 0x1f8) == '\x02') {
              local_68._8_8_ = 0;
              local_68._M_unused._M_object = &local_7c;
              pcStack_50 = std::
                           _Function_handler<wallet::CWallet::TxUpdate_(wallet::CWalletTx_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp:1557:43)>
                           ::_M_invoke;
              local_58 = std::
                         _Function_handler<wallet::CWallet::TxUpdate_(wallet::CWalletTx_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp:1557:43)>
                         ::_M_manager;
              RecursiveUpdateTxState
                        (this,(uint256 *)
                              (*(long *)((long)iVar13.
                                               super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                               ._M_cur + 0x1c0) + 0x39),
                         (TryUpdatingStateFn *)&local_68);
              if (local_58 != (code *)0x0) {
                (*local_58)(&local_68,&local_68,__destroy_functor);
              }
            }
          }
        }
      }
      ptx = ptx + 1;
    } while (ptx != psVar2);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CWallet::blockDisconnected(const interfaces::BlockInfo& block)
{
    assert(block.data);
    LOCK(cs_wallet);

    // At block disconnection, this will change an abandoned transaction to
    // be unconfirmed, whether or not the transaction is added back to the mempool.
    // User may have to call abandontransaction again. It may be addressed in the
    // future with a stickier abandoned state or even removing abandontransaction call.
    m_last_block_processed_height = block.height - 1;
    m_last_block_processed = *Assert(block.prev_hash);

    int disconnect_height = block.height;

    for (const CTransactionRef& ptx : Assert(block.data)->vtx) {
        SyncTransaction(ptx, TxStateInactive{});

        for (const CTxIn& tx_in : ptx->vin) {
            // No other wallet transactions conflicted with this transaction
            if (mapTxSpends.count(tx_in.prevout) < 1) continue;

            std::pair<TxSpends::const_iterator, TxSpends::const_iterator> range = mapTxSpends.equal_range(tx_in.prevout);

            // For all of the spends that conflict with this transaction
            for (TxSpends::const_iterator _it = range.first; _it != range.second; ++_it) {
                CWalletTx& wtx = mapWallet.find(_it->second)->second;

                if (!wtx.isBlockConflicted()) continue;

                auto try_updating_state = [&](CWalletTx& tx) {
                    if (!tx.isBlockConflicted()) return TxUpdate::UNCHANGED;
                    if (tx.state<TxStateBlockConflicted>()->conflicting_block_height >= disconnect_height) {
                        tx.m_state = TxStateInactive{};
                        return TxUpdate::CHANGED;
                    }
                    return TxUpdate::UNCHANGED;
                };

                RecursiveUpdateTxState(wtx.tx->GetHash(), try_updating_state);
            }
        }
    }
}